

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_BrepFace::SetDomain(ON_BrepFace *this,ON_Interval u_dom,ON_Interval v_dom)

{
  ON_Interval new_interval;
  ON_Interval old_interval;
  ON_Interval new_interval_00;
  ON_Interval old_interval_00;
  ON_Interval domain;
  ON_Interval domain_00;
  ON_Interval domain_01;
  ON_Interval new_interval_01;
  ON_Interval old_interval_01;
  ON_Interval new_interval_02;
  ON_Interval old_interval_02;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  shared_ptr<const_ON_Mesh> *psVar3;
  iterator pvVar4;
  element_type *peVar5;
  double *pdVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar7;
  double dVar8;
  double dVar9;
  double *local_5b0;
  double *local_5a8;
  double t1;
  double t0;
  ON_Interval dom1;
  undefined1 local_540 [8];
  ON_Interval dom0;
  ON_Interval *mdom;
  int dir;
  ON_Mesh *pMesh;
  value_type *m;
  iterator __end1;
  iterator __begin1;
  array<std::shared_ptr<const_ON_Mesh>,_3UL> *__range1;
  undefined1 local_4e0 [8];
  array<std::shared_ptr<const_ON_Mesh>,_3UL> meshes;
  undefined1 local_3f0 [8];
  ON_Xform vx_1;
  ON_Xform ux_1;
  ON_Xform local_2a0;
  ON_BrepFace *local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  undefined1 local_1e0 [8];
  ON_Xform vx;
  ON_Xform ux;
  ON_Xform xform;
  ON_Interval v0_dom;
  ON_Interval u0_dom;
  ON_Surface *srf;
  ON_BrepFace *this_local;
  ON_Interval v_dom_local;
  ON_Interval u_dom_local;
  
  v_dom_local.m_t[0] = v_dom.m_t[1];
  this_local = v_dom.m_t[0];
  dVar7 = u_dom.m_t[1];
  v_dom_local.m_t[1] = u_dom.m_t[0];
  if (this->m_brep == (ON_Brep *)0x0) {
    u_dom_local.m_t[1]._7_1_ = false;
  }
  else {
    dVar8 = dVar7;
    bVar1 = ON_Interval::IsIncreasing((ON_Interval *)(v_dom_local.m_t + 1));
    if (bVar1) {
      bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&this_local);
      if (bVar1) {
        u0_dom.m_t[1] = (double)SurfaceOf(this);
        if ((ON_Surface *)u0_dom.m_t[1] == (ON_Surface *)0x0) {
          u_dom_local.m_t[1]._7_1_ = false;
        }
        else {
          (*(((ON_Surface *)u0_dom.m_t[1])->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26]
          )(u0_dom.m_t[1],0);
          v0_dom.m_t[1] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          dVar9 = dVar8;
          (*(((ON_Surface *)u0_dom.m_t[1])->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26]
          )(u0_dom.m_t[1],1);
          xform.m_xform[3][3] = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
          v0_dom.m_t[0] = dVar9;
          bVar1 = ON_Interval::operator==
                            ((ON_Interval *)(v0_dom.m_t + 1),(ON_Interval *)(v_dom_local.m_t + 1));
          if ((bVar1) &&
             (bVar1 = ON_Interval::operator==
                                ((ON_Interval *)(xform.m_xform[3] + 3),(ON_Interval *)&this_local),
             bVar1)) {
            u_dom_local.m_t[1]._7_1_ = true;
          }
          else {
            memcpy(ux.m_xform[3] + 3,&ON_Xform::IdentityTransformation,0x80);
            memcpy(vx.m_xform[3] + 3,&ON_Xform::IdentityTransformation,0x80);
            memcpy(local_1e0,&ON_Xform::IdentityTransformation,0x80);
            bVar1 = ON_Interval::operator!=
                              ((ON_Interval *)(v0_dom.m_t + 1),(ON_Interval *)(v_dom_local.m_t + 1))
            ;
            if (bVar1) {
              local_1f0 = v0_dom.m_t[1];
              local_200 = v_dom_local.m_t[1];
              old_interval_02.m_t[1] = dVar8;
              old_interval_02.m_t[0] = v0_dom.m_t[1];
              new_interval_02.m_t[1] = dVar7;
              new_interval_02.m_t[0] = v_dom_local.m_t[1];
              dVar9 = dVar8;
              local_1f8 = dVar7;
              local_1e8 = dVar8;
              bVar1 = ON_Xform::IntervalChange
                                ((ON_Xform *)(vx.m_xform[3] + 3),0,old_interval_02,new_interval_02);
              if (!bVar1) {
                return false;
              }
            }
            bVar1 = ON_Interval::operator!=
                              ((ON_Interval *)(xform.m_xform[3] + 3),(ON_Interval *)&this_local);
            if (bVar1) {
              local_210 = xform.m_xform[3][3];
              local_208 = v0_dom.m_t[0];
              local_220 = this_local;
              local_218 = v_dom_local.m_t[0];
              old_interval_01.m_t[1] = v0_dom.m_t[0];
              old_interval_01.m_t[0] = xform.m_xform[3][3];
              new_interval_01.m_t[1] = v_dom_local.m_t[0];
              new_interval_01.m_t[0] = (double)this_local;
              dVar9 = v0_dom.m_t[0];
              bVar1 = ON_Xform::IntervalChange
                                ((ON_Xform *)local_1e0,1,old_interval_01,new_interval_01);
              if (!bVar1) {
                return false;
              }
            }
            ON_Xform::operator*(&local_2a0,(ON_Xform *)(vx.m_xform[3] + 3),(ON_Xform *)local_1e0);
            memcpy(ux.m_xform[3] + 3,&local_2a0,0x80);
            (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x17])(this,1);
            iVar2 = ON_Brep::SurfaceUseCount(this->m_brep,this->m_si,2);
            if (1 < iVar2) {
              iVar2 = (*(((ON_Surface *)u0_dom.m_t[1])->super_ON_Geometry).super_ON_Object.
                        _vptr_ON_Object[0x24])();
              u0_dom.m_t[1] = (double)CONCAT44(extraout_var,iVar2);
              iVar2 = ON_Brep::AddSurface(this->m_brep,(ON_Surface *)u0_dom.m_t[1]);
              this->m_si = iVar2;
              ON_SurfaceProxy::SetProxySurface
                        (&this->super_ON_SurfaceProxy,(ON_Surface *)u0_dom.m_t[1]);
            }
            bVar1 = ON_Interval::operator!=
                              ((ON_Interval *)(v_dom_local.m_t + 1),(ON_Interval *)(v0_dom.m_t + 1))
            ;
            if ((!bVar1) ||
               (domain_01.m_t[1] = dVar7, domain_01.m_t[0] = v_dom_local.m_t[1],
               bVar1 = ON_Surface::SetDomain((ON_Surface *)u0_dom.m_t[1],0,domain_01), dVar9 = dVar7
               , bVar1)) {
              bVar1 = ON_Interval::operator!=
                                ((ON_Interval *)&this_local,(ON_Interval *)(xform.m_xform[3] + 3));
              if ((!bVar1) ||
                 (domain_00.m_t[1] = v_dom_local.m_t[0], domain_00.m_t[0] = (double)this_local,
                 dVar9 = v_dom_local.m_t[0],
                 bVar1 = ON_Surface::SetDomain((ON_Surface *)u0_dom.m_t[1],1,domain_00), bVar1)) {
                v_dom_local.m_t[1] =
                     (double)(**(code **)(*(long *)u0_dom.m_t[1] + 0x130))(u0_dom.m_t[1],0);
                dVar7 = dVar9;
                this_local = (ON_BrepFace *)
                             (**(code **)(*(long *)u0_dom.m_t[1] + 0x130))(u0_dom.m_t[1],1);
                v_dom_local.m_t[0] = dVar7;
                memcpy(vx_1.m_xform[3] + 3,&ON_Xform::IdentityTransformation,0x80);
                memcpy(local_3f0,&ON_Xform::IdentityTransformation,0x80);
                bVar1 = ON_Interval::operator!=
                                  ((ON_Interval *)(v0_dom.m_t + 1),
                                   (ON_Interval *)(v_dom_local.m_t + 1));
                if ((!bVar1) ||
                   (old_interval_00.m_t[1] = dVar8, old_interval_00.m_t[0] = v0_dom.m_t[1],
                   new_interval_00.m_t[1] = dVar9, new_interval_00.m_t[0] = v_dom_local.m_t[1],
                   bVar1 = ON_Xform::IntervalChange
                                     ((ON_Xform *)(vx_1.m_xform[3] + 3),0,old_interval_00,
                                      new_interval_00), bVar1)) {
                  bVar1 = ON_Interval::operator!=
                                    ((ON_Interval *)(xform.m_xform[3] + 3),
                                     (ON_Interval *)&this_local);
                  if ((!bVar1) ||
                     (old_interval.m_t[1] = v0_dom.m_t[0], old_interval.m_t[0] = xform.m_xform[3][3]
                     , new_interval.m_t[1] = v_dom_local.m_t[0],
                     new_interval.m_t[0] = (double)this_local,
                     bVar1 = ON_Xform::IntervalChange
                                       ((ON_Xform *)local_3f0,1,old_interval,new_interval), bVar1))
                  {
                    ON_Xform::operator*((ON_Xform *)
                                        &meshes._M_elems[2].
                                         super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount,(ON_Xform *)(vx_1.m_xform[3] + 3),
                                        (ON_Xform *)local_3f0);
                    memcpy(ux.m_xform[3] + 3,
                           &meshes._M_elems[2].
                            super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,0x80);
                    bVar1 = TransformTrim(this,(ON_Xform *)(ux.m_xform[3] + 3));
                    if (bVar1) {
                      psVar3 = UniqueMesh(this,analysis_mesh);
                      std::shared_ptr<const_ON_Mesh>::shared_ptr
                                ((shared_ptr<const_ON_Mesh> *)local_4e0,psVar3);
                      psVar3 = UniqueMesh(this,render_mesh);
                      std::shared_ptr<const_ON_Mesh>::shared_ptr
                                ((shared_ptr<const_ON_Mesh> *)
                                 &meshes._M_elems[0].
                                  super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,psVar3);
                      psVar3 = UniqueMesh(this,preview_mesh);
                      std::shared_ptr<const_ON_Mesh>::shared_ptr
                                ((shared_ptr<const_ON_Mesh> *)
                                 &meshes._M_elems[1].
                                  super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,psVar3);
                      __end1 = std::array<std::shared_ptr<const_ON_Mesh>,_3UL>::begin
                                         ((array<std::shared_ptr<const_ON_Mesh>,_3UL> *)local_4e0);
                      pvVar4 = std::array<std::shared_ptr<const_ON_Mesh>,_3UL>::end
                                         ((array<std::shared_ptr<const_ON_Mesh>,_3UL> *)local_4e0);
                      for (; __end1 != pvVar4; __end1 = __end1 + 1) {
                        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)__end1);
                        if (bVar1) {
                          peVar5 = std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                                             (&__end1->
                                               super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
                                             );
                          for (mdom._4_4_ = 0; mdom._4_4_ < 2; mdom._4_4_ = mdom._4_4_ + 1) {
                            dom0.m_t[1] = (double)(peVar5->m_srf_scale + (long)mdom._4_4_ * 2 + -4);
                            if (mdom._4_4_ == 0) {
                              local_5a8 = v0_dom.m_t + 1;
                            }
                            else {
                              local_5a8 = xform.m_xform[3] + 3;
                            }
                            local_540 = (undefined1  [8])*local_5a8;
                            dom0.m_t[0] = local_5a8[1];
                            if (mdom._4_4_ == 0) {
                              local_5b0 = v_dom_local.m_t + 1;
                            }
                            else {
                              local_5b0 = (double *)&this_local;
                            }
                            t0 = *local_5b0;
                            dom1.m_t[0] = local_5b0[1];
                            bVar1 = ON_Interval::IsIncreasing((ON_Interval *)dom0.m_t[1]);
                            if ((bVar1) &&
                               (bVar1 = ON_Interval::operator!=
                                                  ((ON_Interval *)local_540,(ON_Interval *)&t0),
                               bVar1)) {
                              bVar1 = ON_Interval::operator==
                                                ((ON_Interval *)dom0.m_t[1],(ON_Interval *)local_540
                                                );
                              if (bVar1) {
                                *(double *)dom0.m_t[1] = t0;
                                *(double *)((long)dom0.m_t[1] + 8) = dom1.m_t[0];
                              }
                              else {
                                pdVar6 = ON_Interval::operator[]((ON_Interval *)dom0.m_t[1],0);
                                dVar7 = ON_Interval::NormalizedParameterAt
                                                  ((ON_Interval *)local_540,*pdVar6);
                                dVar7 = ON_Interval::ParameterAt((ON_Interval *)&t0,dVar7);
                                pdVar6 = ON_Interval::operator[]((ON_Interval *)dom0.m_t[1],1);
                                dVar8 = ON_Interval::NormalizedParameterAt
                                                  ((ON_Interval *)local_540,*pdVar6);
                                dVar8 = ON_Interval::ParameterAt((ON_Interval *)&t0,dVar8);
                                ON_Interval::Set((ON_Interval *)dom0.m_t[1],dVar7,dVar8);
                              }
                            }
                          }
                        }
                      }
                      u_dom_local.m_t[1]._7_1_ = true;
                      std::array<std::shared_ptr<const_ON_Mesh>,_3UL>::~array
                                ((array<std::shared_ptr<const_ON_Mesh>,_3UL> *)local_4e0);
                    }
                    else {
                      u_dom_local.m_t[1]._7_1_ = false;
                    }
                  }
                  else {
                    u_dom_local.m_t[1]._7_1_ = false;
                  }
                }
                else {
                  u_dom_local.m_t[1]._7_1_ = false;
                }
              }
              else {
                domain.m_t[1] = dVar8;
                domain.m_t[0] = v0_dom.m_t[1];
                ON_Surface::SetDomain((ON_Surface *)u0_dom.m_t[1],0,domain);
                u_dom_local.m_t[1]._7_1_ = false;
              }
            }
            else {
              u_dom_local.m_t[1]._7_1_ = false;
            }
          }
        }
      }
      else {
        u_dom_local.m_t[1]._7_1_ = false;
      }
    }
    else {
      u_dom_local.m_t[1]._7_1_ = false;
    }
  }
  return u_dom_local.m_t[1]._7_1_;
}

Assistant:

bool ON_BrepFace::SetDomain(
       ON_Interval u_dom,
       ON_Interval v_dom
       )
{
  if ( 0 == m_brep )
    return false;
  if ( !u_dom.IsIncreasing() )
    return false;
  if ( !v_dom.IsIncreasing() )
    return false;
  
  ON_Surface* srf = const_cast<ON_Surface*>(SurfaceOf());
  if ( 0 == srf )
    return false;

  ON_Interval u0_dom = srf->Domain(0);
  ON_Interval v0_dom = srf->Domain(1);
  if ( u0_dom == u_dom && v0_dom == v_dom )
    return true;

  ON_Xform xform(ON_Xform::IdentityTransformation);
  {
    ON_Xform ux(ON_Xform::IdentityTransformation), vx(ON_Xform::IdentityTransformation);
    if ( u0_dom != u_dom )
    {
      if ( !ux.IntervalChange(0,u0_dom,u_dom) )
        return false;
    }
    if ( v0_dom != v_dom )
    {
      if ( !vx.IntervalChange(1,v0_dom,v_dom) )
        return false;
    }
    xform = ux*vx;
  }

// 2/18/03 GBA.  Destroy cache on the face.
	DestroyRuntimeCache(true);

  if ( m_brep->SurfaceUseCount( m_si, 2 ) > 1 )
  {
    srf = srf->DuplicateSurface();
    m_si = m_brep->AddSurface(srf);
    SetProxySurface(srf);
  }

  if ( u_dom != u0_dom )
  {
    if ( !srf->SetDomain( 0, u_dom ) )
      return false;
  }

  if ( v_dom != v0_dom )
  {
    if ( !srf->SetDomain( 1, v_dom ) )
    {
      srf->SetDomain(0,u0_dom );
      return false;
    }
  }

  // just to be sure 2d curves are in synch with actual surface
  // domain in case srf->SetDomain() does something weird.
  u_dom = srf->Domain(0);
  v_dom = srf->Domain(1);
  {
    ON_Xform ux(ON_Xform::IdentityTransformation), vx(ON_Xform::IdentityTransformation);
    if ( u0_dom != u_dom )
    {
      if ( !ux.IntervalChange(0,u0_dom,u_dom) )
        return false;
    }
    if ( v0_dom != v_dom )
    {
      if ( !vx.IntervalChange(1,v0_dom,v_dom) )
        return false;
    }
    xform = ux*vx;
  }

  if ( !TransformTrim(xform) )
    return false;

  std::array<std::shared_ptr<const ON_Mesh>, 3> meshes { UniqueMesh(ON::analysis_mesh),  UniqueMesh(ON::render_mesh),  UniqueMesh(ON::preview_mesh) };

  for (auto& m : meshes)
  {
    if (m)
    {
      auto pMesh = const_cast<ON_Mesh*>(m.get());
      for ( int dir = 0; dir < 2; dir++ )
      {
        ON_Interval& mdom = pMesh->m_srf_domain[dir];

        const ON_Interval dom0 = dir ? v0_dom : u0_dom;
        const ON_Interval dom1 = dir ? v_dom : u_dom;

        if ( mdom.IsIncreasing() && dom0 != dom1 )
        {
          if ( mdom == dom0 )
          {
            mdom = dom1;
          }
          else
          {
            double t0 = dom1.ParameterAt(dom0.NormalizedParameterAt(mdom[0]));
            double t1 = dom1.ParameterAt(dom0.NormalizedParameterAt(mdom[1]));
            mdom.Set(t0,t1);
          }
        }
      }
    }
  }

  return true;
}